

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

int32_t __thiscall
icu_63::NFRule::findText
          (NFRule *this,UnicodeString *str,UnicodeString *key,int32_t startingAt,int32_t *length)

{
  bool bVar1;
  int8_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t srcLength;
  int iVar7;
  undefined1 local_160 [8];
  UnicodeString suffix;
  UnicodeString prefix;
  int32_t matchLen;
  int32_t pluralRuleSuffix;
  int32_t pluralRuleStart;
  int start;
  undefined1 local_c0 [8];
  FieldPosition position;
  Formattable result;
  int32_t *length_local;
  int32_t startingAt_local;
  UnicodeString *key_local;
  UnicodeString *str_local;
  NFRule *this_local;
  
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    iVar7 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    if ((char)iVar7 == '\0') {
      iVar3 = UnicodeString::length(key);
      *length = iVar3;
      iVar3 = UnicodeString::indexOf(str,key,startingAt);
      return iVar3;
    }
    iVar3 = findTextLenient(this,str,key,startingAt,length);
    return iVar3;
  }
  Formattable::Formattable((Formattable *)&position.fEndIndex);
  FieldPosition::FieldPosition((FieldPosition *)local_c0,0);
  FieldPosition::setBeginIndex((FieldPosition *)local_c0,startingAt);
  PluralFormat::parseType
            (this->rulePatternFormat,str,this,(Formattable *)&position.fEndIndex,
             (FieldPosition *)local_c0);
  iVar3 = FieldPosition::getBeginIndex((FieldPosition *)local_c0);
  if (-1 < iVar3) {
    iVar4 = UnicodeString::indexOf(&this->fRuleText,L"$(",-1,0);
    iVar5 = UnicodeString::indexOf(&this->fRuleText,L")$",-1,iVar4);
    iVar6 = FieldPosition::getEndIndex((FieldPosition *)local_c0);
    UnicodeString::tempSubString
              ((UnicodeString *)((long)&suffix.fUnion + 0x30),&this->fRuleText,0,iVar4);
    UnicodeString::tempSubString((UnicodeString *)local_160,&this->fRuleText,iVar5 + 2,0x7fffffff);
    iVar4 = UnicodeString::length((UnicodeString *)((long)&suffix.fUnion + 0x30));
    iVar5 = UnicodeString::length((UnicodeString *)((long)&suffix.fUnion + 0x30));
    srcLength = UnicodeString::length((UnicodeString *)((long)&suffix.fUnion + 0x30));
    iVar2 = UnicodeString::compare
                      (str,iVar3 - iVar4,iVar5,(UnicodeString *)((long)&suffix.fUnion + 0x30),0,
                       srcLength);
    if (iVar2 == '\0') {
      iVar4 = UnicodeString::length((UnicodeString *)local_160);
      iVar5 = UnicodeString::length((UnicodeString *)local_160);
      iVar2 = UnicodeString::compare
                        (str,iVar3 + (iVar6 - iVar3),iVar4,(UnicodeString *)local_160,0,iVar5);
      if (iVar2 != '\0') goto LAB_002c7849;
      iVar4 = UnicodeString::length((UnicodeString *)((long)&suffix.fUnion + 0x30));
      iVar5 = UnicodeString::length((UnicodeString *)local_160);
      *length = (iVar6 - iVar3) + iVar4 + iVar5;
      iVar4 = UnicodeString::length((UnicodeString *)((long)&suffix.fUnion + 0x30));
      this_local._4_4_ = iVar3 - iVar4;
      bVar1 = true;
    }
    else {
LAB_002c7849:
      bVar1 = false;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_160);
    UnicodeString::~UnicodeString((UnicodeString *)((long)&suffix.fUnion + 0x30));
    if (bVar1) goto LAB_002c78a2;
  }
  *length = 0;
  this_local._4_4_ = -1;
LAB_002c78a2:
  FieldPosition::~FieldPosition((FieldPosition *)local_c0);
  Formattable::~Formattable((Formattable *)&position.fEndIndex);
  return this_local._4_4_;
}

Assistant:

int32_t
NFRule::findText(const UnicodeString& str,
                 const UnicodeString& key,
                 int32_t startingAt,
                 int32_t* length) const
{
    if (rulePatternFormat) {
        Formattable result;
        FieldPosition position(UNUM_INTEGER_FIELD);
        position.setBeginIndex(startingAt);
        rulePatternFormat->parseType(str, this, result, position);
        int start = position.getBeginIndex();
        if (start >= 0) {
            int32_t pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
            int32_t pluralRuleSuffix = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart) + 2;
            int32_t matchLen = position.getEndIndex() - start;
            UnicodeString prefix(fRuleText.tempSubString(0, pluralRuleStart));
            UnicodeString suffix(fRuleText.tempSubString(pluralRuleSuffix));
            if (str.compare(start - prefix.length(), prefix.length(), prefix, 0, prefix.length()) == 0
                    && str.compare(start + matchLen, suffix.length(), suffix, 0, suffix.length()) == 0)
            {
                *length = matchLen + prefix.length() + suffix.length();
                return start - prefix.length();
            }
        }
        *length = 0;
        return -1;
    }
    if (!formatter->isLenient()) {
        // if lenient parsing is turned off, this is easy: just call
        // String.indexOf() and we're done
        *length = key.length();
        return str.indexOf(key, startingAt);
    }
    else {
        // but if lenient parsing is turned ON, we've got some work
        // ahead of us
        return findTextLenient(str, key, startingAt, length);
    }
}